

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugManager.cpp
# Opt level: O1

void __thiscall
Js::DebugManager::UpdateConsoleScope
          (DebugManager *this,DynamicObject *copyFromScope,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int propertyId;
  BOOL BVar4;
  undefined4 *puVar5;
  DynamicObject *object;
  PropertyRecord *pPVar6;
  uint uVar7;
  ulong uVar8;
  undefined1 local_88 [8];
  PropertyDescriptor propertyDescriptor;
  
  if (copyFromScope == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugManager.cpp"
                                ,0xa9,"(copyFromScope != nullptr)","copyFromScope != nullptr");
    if (!bVar2) {
LAB_008b8e2e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  object = GetConsoleScope(this,scriptContext);
  uVar3 = (*(copyFromScope->super_RecyclableObject).super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[10])(copyFromScope);
  if (uVar3 != 0) {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar8 = 0;
    propertyDescriptor._40_8_ = copyFromScope;
    do {
      propertyId = (*(copyFromScope->super_RecyclableObject).super_FinalizableObject.
                     super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])
                             (copyFromScope,uVar8 & 0xffff);
      if (propertyId != -1) {
        PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_88);
        BVar4 = JavascriptOperators::GetOwnPropertyDescriptor
                          (&copyFromScope->super_RecyclableObject,propertyId,scriptContext,
                           (PropertyDescriptor *)local_88);
        if (BVar4 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugManager.cpp"
                                      ,0xb5,"(gotPropertyValue)",
                                      "DebugManager::UpdateConsoleScope Should have got valid value?"
                                     );
          if (!bVar2) goto LAB_008b8e2e;
          *puVar5 = 0;
          copyFromScope = (DynamicObject *)propertyDescriptor._40_8_;
        }
        pPVar6 = ScriptContext::GetPropertyName(scriptContext,propertyId);
        Output::Trace(ConsoleScopePhase,L"Adding property \'%s\'\n",pPVar6 + 1);
        BVar4 = JavascriptOperators::SetPropertyDescriptor
                          (&object->super_RecyclableObject,propertyId,(PropertyDescriptor *)local_88
                          );
        if (BVar4 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugManager.cpp"
                                      ,0xba,"(updateSuccess)",
                                      "DebugManager::UpdateConsoleScope Unable to update property value. Am I missing a scenario?"
                                     );
          if (!bVar2) goto LAB_008b8e2e;
          *puVar5 = 0;
        }
      }
      uVar7 = (int)uVar8 + 1;
      uVar8 = (ulong)uVar7;
    } while (uVar3 != uVar7);
  }
  uVar3 = (*(object->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[10])();
  Output::Trace(ConsoleScopePhase,
                L"Number of properties on console scope object after update are %d\n",(ulong)uVar3);
  return;
}

Assistant:

void DebugManager::UpdateConsoleScope(DynamicObject* copyFromScope, ScriptContext* scriptContext)
    {
        Assert(copyFromScope != nullptr);
        DynamicObject* consoleScope = this->GetConsoleScope(scriptContext);

        uint32 newPropCount = copyFromScope->GetPropertyCount();
        for (uint32 i = 0; i < newPropCount; i++)
        {
            Js::PropertyId propertyId = copyFromScope->GetPropertyId((Js::PropertyIndex)i);
            // For deleted properties we won't have a property id
            if (propertyId != Js::Constants::NoProperty)
            {
                PropertyDescriptor propertyDescriptor;
                BOOL gotPropertyValue = JavascriptOperators::GetOwnPropertyDescriptor(copyFromScope, propertyId, scriptContext, &propertyDescriptor);
                AssertMsg(gotPropertyValue, "DebugManager::UpdateConsoleScope Should have got valid value?");

                OUTPUT_TRACE(Js::ConsoleScopePhase, _u("Adding property '%s'\n"), scriptContext->GetPropertyName(propertyId)->GetBuffer());

                BOOL updateSuccess = JavascriptOperators::SetPropertyDescriptor(consoleScope, propertyId, propertyDescriptor);
                AssertMsg(updateSuccess, "DebugManager::UpdateConsoleScope Unable to update property value. Am I missing a scenario?");
            }
        }

        OUTPUT_TRACE(Js::ConsoleScopePhase, _u("Number of properties on console scope object after update are %d\n"), consoleScope->GetPropertyCount());
    }